

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  uint uVar4;
  Arena *pAVar5;
  word *pwVar6;
  size_t sVar7;
  ReadLimiter *pRVar8;
  char *pcVar9;
  char cVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar12;
  short sVar13;
  CapTableReader *pCVar14;
  SegmentReader **ppSVar15;
  uint uVar16;
  char *macroArgs;
  ElementSize EVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  SegmentBuilder **ppSVar21;
  OrphanBuilder *pOVar22;
  SegmentReader **ppSVar23;
  uint uVar24;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  ulong uVar25;
  bool bVar26;
  SegmentReader *newSegment;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentBuilder *local_60;
  Fault f_2;
  uint pointerCount;
  CapTableReader *local_48;
  uint local_3c;
  WirePointerCount expectedPointersPerElement;
  BitCount expectedDataBitsPerElement;
  
  local_60 = this->segment;
  pCVar14 = &this->capTable->super_CapTableReader;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && (int)(this->tag).content == 0)
  goto LAB_00189b23;
  ppSVar21 = (SegmentBuilder **)this->location;
  pOVar22 = this;
  if ((local_60 != (SegmentBuilder *)0x0) && (((this->tag).content & 3) == 2)) {
    pAVar5 = (local_60->super_SegmentReader).arena;
    iVar11 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)*(uint *)((long)&(this->tag).content + 4));
    local_60 = (SegmentBuilder *)CONCAT44(extraout_var,iVar11);
    _kjCondition.left = (SegmentReader **)&local_60;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_60 != (SegmentBuilder *)0x0;
    if (local_60 == (SegmentBuilder *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar18 = (uint)(this->tag).content;
      uVar25 = (ulong)(uVar18 >> 3);
      uVar20 = (local_60->super_SegmentReader).ptr.size_;
      if ((long)uVar20 < (long)uVar25) {
        uVar25 = uVar20;
      }
      pOVar22 = (OrphanBuilder *)((local_60->super_SegmentReader).ptr.ptr + uVar25);
      if (local_60 == (SegmentBuilder *)0x0) {
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_0018917a:
        if (((this->tag).content & 4) == 0) {
          ppSVar1 = &pOVar22->segment;
          lVar12 = (long)((int)(pOVar22->tag).content >> 2);
          if (local_60 == (SegmentBuilder *)0x0) {
            ppSVar21 = ppSVar1 + lVar12;
          }
          else {
            pwVar6 = (local_60->super_SegmentReader).ptr.ptr;
            ppSVar21 = (SegmentBuilder **)(pwVar6 + (local_60->super_SegmentReader).ptr.size_);
            if (((long)pwVar6 - (long)ppSVar1 >> 3 <= lVar12) &&
               (lVar12 <= (long)ppSVar21 - (long)ppSVar1 >> 3)) {
              ppSVar21 = ppSVar1 + lVar12;
            }
          }
          goto LAB_0018934f;
        }
        pAVar5 = (local_60->super_SegmentReader).arena;
        iVar11 = (*pAVar5->_vptr_Arena[2])
                           (pAVar5,(ulong)*(uint *)((long)&(pOVar22->tag).content + 4));
        newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar11);
        _kjCondition.left = &newSegment;
        _kjCondition.right = (void *)0x0;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
        if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                    (&f_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x25f,FAILED,"newSegment != nullptr",
                     "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                     &_kjCondition,
                     (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_00189337:
          ppSVar21 = (SegmentBuilder **)0x0;
          kj::_::Debug::Fault::~Fault(&f_2);
        }
        else {
          uVar18 = (uint)(pOVar22->tag).content & 3;
          _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar18);
          _kjCondition.right = " == ";
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = (size_t)(uVar18 == 2);
          if (uVar18 != 2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                      (&f_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                       "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                       (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                       &_kjCondition,
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
            goto LAB_00189337;
          }
          uVar20 = (ulong)((uint)(pOVar22->tag).content >> 3);
          sVar7 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
          if ((long)sVar7 < (long)uVar20) {
            uVar20 = sVar7;
          }
          ppSVar21 = (SegmentBuilder **)
                     ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar20);
          local_60 = (SegmentBuilder *)newSegment;
        }
        pOVar22 = (OrphanBuilder *)&pOVar22->segment;
        goto LAB_0018934f;
      }
      uVar19 = 2 - (ulong)((uVar18 & 4) == 0);
      if (uVar20 < uVar25 + uVar19) {
        newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
      }
      else {
        pRVar8 = (local_60->super_SegmentReader).readLimiter;
        uVar20 = pRVar8->limit;
        local_48 = pCVar14;
        if (uVar20 < uVar19) {
          (*((local_60->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        else {
          pRVar8->limit = uVar20 - uVar19;
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar19 <= uVar20);
        pCVar14 = local_48;
        if (uVar19 <= uVar20) goto LAB_0018917a;
      }
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
    kj::_::Debug::Fault::~Fault((Fault *)this_00);
    ppSVar21 = (SegmentBuilder **)0x0;
    pOVar22 = this;
  }
LAB_0018934f:
  if (ppSVar21 == (SegmentBuilder **)0x0) {
    cVar10 = (ppSVar21 == (SegmentBuilder **)0x0) * '\x02';
  }
  else {
    uVar18 = (uint)(pOVar22->tag).content & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar18);
    _kjCondition.right = " == ";
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar18 == 1);
    local_48 = pCVar14;
    if (uVar18 == 1) {
      uVar18 = *(uint *)((long)&(pOVar22->tag).content + 4);
      EVar17 = (ElementSize)uVar18 & INLINE_COMPOSITE;
      if (EVar17 == INLINE_COMPOSITE) {
        f_2.exception._0_4_ = uVar18 >> 3;
        if (local_60 == (SegmentBuilder *)0x0) {
          bVar26 = true;
        }
        else if ((local_60->super_SegmentReader).ptr.size_ <
                 ((long)ppSVar21 - (long)(local_60->super_SegmentReader).ptr.ptr >> 3) +
                 (ulong)(uint)f_2.exception + 1) {
          bVar26 = false;
        }
        else {
          uVar25 = (ulong)(uint)f_2.exception + 1;
          pRVar8 = (local_60->super_SegmentReader).readLimiter;
          uVar20 = pRVar8->limit;
          bVar26 = uVar20 >= uVar25;
          if (uVar20 < uVar25) {
            (*((local_60->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          else {
            pRVar8->limit = uVar20 - uVar25;
          }
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar26);
        if (bVar26 == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x900,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar10 = '\x02';
        }
        else {
          uVar18 = *(uint *)ppSVar21 & 3;
          _kjCondition.left = (SegmentReader **)(ulong)uVar18;
          _kjCondition.right = " == ";
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar18 == 0);
          if (uVar18 == 0) {
            uVar24 = *(uint *)ppSVar21 >> 2 & 0x1fffffff;
            uVar20 = (ulong)uVar24;
            uVar18 = (uint)*(ushort *)((long)ppSVar21 + 6) + (uint)*(ushort *)((long)ppSVar21 + 4);
            ppSVar15 = (SegmentReader **)(uVar18 * uVar20);
            _kjCondition.right = &f_2;
            ppSVar23 = (SegmentReader **)(ulong)(uint)f_2.exception;
            cVar10 = '\0';
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            bVar26 = (long)ppSVar15 - (long)ppSVar23 == 0;
            _kjCondition.result = ppSVar15 < ppSVar23 || bVar26;
            _kjCondition.left = ppSVar15;
            if (ppSVar15 >= ppSVar23 && !bVar26) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                        ((Fault *)&newSegment,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount"
                         ,
                         "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                         ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
              kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
              cVar10 = '\x02';
            }
            if (ppSVar15 < ppSVar23 || (long)ppSVar15 - (long)ppSVar23 == 0) {
              if (uVar18 == 0) {
                if (local_60 == (SegmentBuilder *)0x0) {
                  bVar26 = true;
                }
                else {
                  pRVar8 = (local_60->super_SegmentReader).readLimiter;
                  uVar25 = pRVar8->limit;
                  bVar26 = uVar25 >= uVar20;
                  if (uVar25 < uVar20) {
                    (*((local_60->super_SegmentReader).arena)->_vptr_Arena[3])();
                  }
                  else {
                    pRVar8->limit = uVar25 - uVar20;
                  }
                }
                newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar26);
                if (bVar26 == false) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            ((Fault *)&_kjCondition,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x917,FAILED,"amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))"
                             ,"_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)&newSegment,
                             (char (*) [41])"Message contains amplified list pointer.");
                  kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                  cVar10 = '\x02';
                  goto LAB_00189b1e;
                }
              }
              if (elementSize - 2 < 4) {
                sVar13 = *(short *)((long)ppSVar21 + 4);
                cVar10 = '\0';
                _kjCondition.left = (SegmentReader **)CONCAT62(_kjCondition.left._2_6_,sVar13);
                _kjCondition.left = (SegmentReader **)((ulong)_kjCondition.left & 0xffffffff);
                _kjCondition.right = anon_var_dwarf_1a2f00;
                _kjCondition.op.content.ptr = (char *)0x4;
                _kjCondition.op.content.size_ =
                     CONCAT71(_kjCondition.op.content.size_._1_7_,sVar13 != 0);
                if (sVar13 == 0) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[84]>
                            ((Fault *)&newSegment,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x935,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                             "_kjCondition,\"Schema mismatch: Expected a primitive list, but got a list of pointer-only \" \"structs.\""
                             ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                             (char (*) [84])
                             "Schema mismatch: Expected a primitive list, but got a list of pointer-only structs."
                            );
LAB_00189a4c:
                  kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
                  cVar10 = '\x02';
                }
LAB_00189acb:
                if (sVar13 == 0) goto LAB_00189b1e;
              }
              else {
                if (elementSize == POINTER) {
                  sVar13 = *(short *)((long)ppSVar21 + 6);
                  cVar10 = '\0';
                  _kjCondition.left = (SegmentReader **)CONCAT62(_kjCondition.left._2_6_,sVar13);
                  _kjCondition.left = (SegmentReader **)((ulong)_kjCondition.left & 0xffffffff);
                  _kjCondition.right = anon_var_dwarf_1a2f00;
                  _kjCondition.op.content.ptr = (char *)0x4;
                  _kjCondition.op.content.size_ =
                       CONCAT71(_kjCondition.op.content.size_._1_7_,sVar13 != 0);
                  if (sVar13 == 0) {
                    kj::_::Debug::Fault::
                    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[79]>
                              ((Fault *)&newSegment,
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                               ,0x93d,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                               "_kjCondition,\"Schema mismatch: Expected a pointer list, but got a list of data-only \" \"structs.\""
                               ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                               (char (*) [79])
                               "Schema mismatch: Expected a pointer list, but got a list of data-only structs."
                              );
                    goto LAB_00189a4c;
                  }
                  goto LAB_00189acb;
                }
                if (elementSize == BIT) {
                  pcVar9 = 
                  "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                  ;
                  macroArgs = 
                  "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                  ;
                  iVar11 = 0x92a;
                  goto LAB_001897e8;
                }
              }
              uVar2 = *(ushort *)((long)ppSVar21 + 4);
              SVar3 = *(StructPointerCount *)((long)ppSVar21 + 6);
              __return_storage_ptr__->segment = &local_60->super_SegmentReader;
              __return_storage_ptr__->capTable = local_48;
              __return_storage_ptr__->ptr = (byte *)(ppSVar21 + 1);
              __return_storage_ptr__->elementCount = uVar24;
              __return_storage_ptr__->step = uVar18 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = SVar3;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_00189b0d:
              __return_storage_ptr__->nestingLimit = 0x7ffffffe;
              cVar10 = '\x01';
            }
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      ((Fault *)&newSegment,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
            cVar10 = '\x02';
          }
        }
      }
      else {
        f_2.exception._0_4_ = (&BITS_PER_ELEMENT_TABLE)[EVar17];
        pointerCount = (uint)(EVar17 == POINTER);
        uVar20 = (ulong)(uVar18 >> 3);
        uVar24 = pointerCount * 0x40 + (uint)f_2.exception;
        if (local_60 == (SegmentBuilder *)0x0) {
          bVar26 = true;
        }
        else {
          uVar25 = uVar24 * uVar20 + 0x3f >> 6 & 0xffffffff;
          if ((local_60->super_SegmentReader).ptr.size_ <
              ((long)ppSVar21 - (long)(local_60->super_SegmentReader).ptr.ptr >> 3) + uVar25) {
            bVar26 = false;
          }
          else {
            pRVar8 = (local_60->super_SegmentReader).readLimiter;
            uVar19 = pRVar8->limit;
            bVar26 = uVar19 >= uVar25;
            if (uVar19 < uVar25) {
              (*((local_60->super_SegmentReader).arena)->_vptr_Arena[3])();
            }
            else {
              pRVar8->limit = uVar19 - uVar25;
            }
          }
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar26);
        if (bVar26 == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x958,FAILED,"boundsCheck(segment, ptr, wordCount)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar10 = '\x02';
        }
        else {
          if ((uVar18 & 7) == 0) {
            if (local_60 == (SegmentBuilder *)0x0) {
              bVar26 = true;
            }
            else {
              pRVar8 = (local_60->super_SegmentReader).readLimiter;
              uVar25 = pRVar8->limit;
              bVar26 = uVar25 >= uVar20;
              if (uVar25 < uVar20) {
                (*((local_60->super_SegmentReader).arena)->_vptr_Arena[3])();
              }
              else {
                pRVar8->limit = uVar25 - uVar20;
              }
            }
            newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar26);
            if (bVar26 == false) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                        ((Fault *)&_kjCondition,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x960,FAILED,
                         "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))",
                         "_kjCondition,\"Message contains amplified list pointer.\"",
                         (DebugExpression<bool> *)&newSegment,
                         (char (*) [41])"Message contains amplified list pointer.");
              kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
              cVar10 = '\x02';
              goto LAB_00189b1e;
            }
          }
          if ((elementSize == BIT) || (EVar17 != BIT)) {
            uVar4 = (&BITS_PER_ELEMENT_TABLE)[(uint)elementSize];
            _kjCondition.left = (SegmentReader **)&expectedDataBitsPerElement;
            expectedPointersPerElement = (WirePointerCount)(elementSize == POINTER);
            _kjCondition.right = &f_2;
            cVar10 = '\0';
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = uVar4 <= (uint)f_2.exception;
            uVar16 = (uint)f_2.exception;
            expectedDataBitsPerElement = uVar4;
            if ((uint)f_2.exception < uVar4) {
              local_3c = (uint)f_2.exception;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                        ((Fault *)&newSegment,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x979,FAILED,"expectedDataBitsPerElement <= dataSize",
                         "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                         ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [72])
                         "Schema mismatch: Message contained list with incompatible element type.");
              kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
              cVar10 = '\x02';
              uVar16 = local_3c;
            }
            if (uVar4 <= uVar16) {
              _kjCondition.left = (SegmentReader **)&expectedPointersPerElement;
              cVar10 = '\0';
              _kjCondition.right = &pointerCount;
              _kjCondition.op.content.ptr = " <= ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = expectedPointersPerElement <= pointerCount;
              if (pointerCount < expectedPointersPerElement) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                          ((Fault *)&newSegment,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x97d,FAILED,"expectedPointersPerElement <= pointerCount",
                           "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                           ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                           (char (*) [72])
                           "Schema mismatch: Message contained list with incompatible element type."
                          );
                kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
                cVar10 = '\x02';
              }
            }
            if (cVar10 == '\0') {
              __return_storage_ptr__->segment = &local_60->super_SegmentReader;
              __return_storage_ptr__->capTable = local_48;
              __return_storage_ptr__->ptr = (byte *)ppSVar21;
              __return_storage_ptr__->elementCount = uVar18 >> 3;
              __return_storage_ptr__->step = uVar24;
              __return_storage_ptr__->structDataSize = (uint)f_2.exception;
              __return_storage_ptr__->structPointerCount = (StructPointerCount)pointerCount;
              __return_storage_ptr__->elementSize = EVar17;
              goto LAB_00189b0d;
            }
          }
          else {
            pcVar9 = 
            "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
            ;
            macroArgs = 
            "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
            ;
            iVar11 = 0x969;
LAB_001897e8:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,iVar11,FAILED,(char *)0x0,macroArgs,(char (*) [106])(pcVar9 + 0x11));
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            cVar10 = '\x02';
          }
        }
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                ((Fault *)&newSegment,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [84])
                 "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
      cVar10 = '\x02';
    }
  }
LAB_00189b1e:
  if (cVar10 != '\x02') {
    return __return_storage_ptr__;
  }
LAB_00189b23:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = elementSize;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}